

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_change_item_quantity(command *cmd)

{
  ushort uVar1;
  player *p;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint16_t uVar5;
  char *fmt;
  object *obj;
  wchar_t n;
  wchar_t update;
  char s [80];
  char prompt [80];
  
  update = L'\0';
  wVar3 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj);
  if (wVar3 == L'\0') {
    _Var2 = object_is_equipped(player->body,obj);
    if (_Var2) {
      fmt = "Can not change the quantity of an equipped item.";
      goto LAB_00130860;
    }
  }
  else {
    _Var2 = get_item(&obj,"Change quantity of which item? ","You have nothing to change.",cmd->code,
                     (item_tester)0x0,L'\x0e');
    if (!_Var2) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",obj);
  }
  if (obj->artifact == (artifact *)0x0) {
    wVar3 = obj->kind->base->max_stack;
    _Var2 = tval_can_have_charges(obj);
    if ((((_Var2) && (0 < obj->pval)) && (obj->number != 0)) &&
       (wVar4 = ((uint)obj->number * 0x7fff) / (uint)(int)obj->pval, wVar4 < wVar3)) {
      wVar3 = wVar4;
    }
    _Var2 = object_is_in_quiver(player,obj);
    if (_Var2) {
      uVar1 = z_info->quiver_slot_size;
      _Var2 = tval_is_ammo(obj);
      uVar5 = 1;
      if (!_Var2) {
        uVar5 = z_info->thrown_quiver_mult;
      }
      if ((int)((uint)uVar1 / (uint)uVar5) <= wVar3) {
        uVar1 = z_info->quiver_slot_size;
        _Var2 = tval_is_ammo(obj);
        uVar5 = 1;
        if (!_Var2) {
          uVar5 = z_info->thrown_quiver_mult;
        }
        wVar3 = (wchar_t)(uVar1 / uVar5);
      }
    }
    wVar4 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&n);
    if (wVar4 != L'\0') {
      strnfmt(prompt,0x50,"Quantity (1-%d): ",(ulong)(uint)wVar3);
      strnfmt(s,0x50,"%d",(ulong)obj->number);
      _Var2 = get_string(prompt,s,0x50);
      if (!_Var2) {
        return;
      }
      _Var2 = get_int_from_string(s,&n);
      if (n < L'\x01' || !_Var2) {
        return;
      }
      if (obj->kind->base->max_stack < n) {
        return;
      }
      cmd_set_arg_number((command_conflict *)cmd,"quantity",n);
    }
    wVar4 = n;
    if (wVar3 < n) {
      wVar4 = wVar3;
    }
    n = L'\x01';
    if (L'\x01' < wVar4) {
      n = wVar4;
    }
    if (n == (uint)obj->number) {
      return;
    }
    _Var2 = tval_can_have_charges(obj);
    if ((_Var2) && (obj->number != 0)) {
      obj->pval = (int16_t)((obj->pval * n) / (int)(uint)obj->number);
    }
    _Var2 = tval_can_have_timeout(obj);
    if ((_Var2) && (obj->number != 0)) {
      obj->timeout = (int16_t)((obj->timeout * n) / (int)(uint)obj->number);
    }
    wVar3 = cmd_get_arg_choice((command_conflict *)cmd,"update",&update);
    if (wVar3 == L'\0' && update == L'\0') {
      wiz_play_item_notify_changed();
    }
    else {
      _Var2 = object_is_carried(player,obj);
      p = player;
      if (_Var2) {
        player->upkeep->total_weight =
             obj->weight * n + (player->upkeep->total_weight - (uint)obj->number * (int)obj->weight)
        ;
      }
      wiz_play_item_standard_upkeep(p,obj);
    }
    obj->number = (uint8_t)n;
    return;
  }
  fmt = "Can not modify the quantity of an artifact.";
LAB_00130860:
  msg(fmt);
  return;
}

Assistant:

void do_cmd_wiz_change_item_quantity(struct command *cmd)
{
	struct object *obj;
	int n, nmax;
	int update = 0;

	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Change quantity of which item? ",
				"You have nothing to change.", cmd->code,
				NULL, (USE_INVEN | USE_QUIVER | USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	} else if (object_is_equipped(player->body, obj)) {
		msg("Can not change the quantity of an equipped item.");
		return;
	}

	/* Don't allow multiple artifacts. */
	if (obj->artifact) {
		msg("Can not modify the quantity of an artifact.");
		return;
	}

	/* Find limit on stack size. */
	nmax = obj->kind->base->max_stack;
	if (tval_can_have_charges(obj) && obj->pval > 0 && obj->number > 0) {
		/* Items with charges have a limit imposed by MAX_PVAL. */
		nmax = MIN((MAX_PVAL * obj->number) / obj->pval, nmax);
	}
	if (object_is_in_quiver(player, obj)) {
		/* The quiver may have stricter limits. */
		nmax = MIN(z_info->quiver_slot_size /
			(tval_is_ammo(obj) ? 1 : z_info->thrown_quiver_mult),
			nmax);
	}

	/* Get the new quantity. */
	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		char prompt[80], s[80];

		strnfmt(prompt, sizeof(prompt), "Quantity (1-%d): ", nmax);

		/* Set the default value. */
		strnfmt(s, sizeof(s), "%d", obj->number);

		if (!get_string(prompt, s, sizeof(s)) ||
				!get_int_from_string(s, &n) ||
				n < 1 || n > obj->kind->base->max_stack) {
			return;
		}

		cmd_set_arg_number(cmd, "quantity", n);
	}

	/* Impose limits. */
	n = MAX(1, MIN(nmax, n));

	if (n != obj->number) {
		/* Adjust charges or timeouts for devices. */
		if (tval_can_have_charges(obj) && obj->number > 0) {
			obj->pval = (obj->pval * n) / obj->number;
		}
		if (tval_can_have_timeout(obj) && obj->number > 0) {
			obj->timeout = (obj->timeout * n) / obj->number;
		}

		/* Accept change. */
		if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK ||
				update) {
			if (object_is_carried(player, obj)) {
				/*
				 * Remove the weight of the old number of
				 * objects.
				 */
				player->upkeep->total_weight -=
					obj->number * obj->weight;

				/*
				 * Add the weight of the new number of objects.
				 */
				player->upkeep->total_weight += n * obj->weight;
			}
			wiz_play_item_standard_upkeep(player, obj);
		} else {
			wiz_play_item_notify_changed();
		}
		obj->number = n;
	}
}